

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

wstring * __thiscall
lzstring::LZString::DeCompressFromUint8Array_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong local_48;
  size_t i;
  wstring res;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *input_local;
  LZString *this_local;
  
  res.field_2._8_8_ = input;
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(input);
  if (bVar2) {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&i);
    local_48 = 0;
    while( true ) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)res.field_2._8_8_)
      ;
      if (sVar3 >> 1 <= local_48) break;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)res.field_2._8_8_
                          ,local_48 * 2);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)res.field_2._8_8_
                          ,local_48 * 2 + 1);
      std::__cxx11::wstring::operator+=((wstring *)&i,(uint)CONCAT11(vVar1,*pvVar4));
      local_48 = local_48 + 1;
    }
    DeCompress(__return_storage_ptr__,this,(wstring *)&i);
    std::__cxx11::wstring::~wstring((wstring *)&i);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompressFromUint8Array(const std::vector<uint8_t> &input)
{
	if (input.empty())
		return std::wstring();

	std::wstring res;
	for (size_t i = 0; i < input.size() / 2; i++)
	{
		res += (wchar_t)(input[i * 2] * 256 + input[i * 2 + 1]);
	}

	return DeCompress(res);
}